

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::SimpleProgramCase::compileShaders(SimpleProgramCase *this)

{
  CallLogWrapper *this_00;
  GLuint shader;
  GLuint shader_00;
  GLenum err;
  TestError *this_01;
  char *fragSource;
  char *vertSource;
  char *local_30;
  char *local_28;
  
  local_28 = "void main (void) { gl_Position = vec4(0.0); }\n";
  local_30 = "void main (void) { gl_FragColor = vec4(0.0); }\n";
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  if (shader == 0) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"vertShader != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
               ,0x19b);
  }
  else {
    if (shader_00 != 0) {
      glu::CallLogWrapper::glShaderSource(this_00,shader,1,&local_28,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(this_00,shader);
      glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,&local_30,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(this_00,shader_00);
      err = glu::CallLogWrapper::glGetError(this_00);
      glu::checkError(err,(char *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
                      ,0x1a4);
      this->m_vertShader = shader;
      this->m_fragShader = shader_00;
      return;
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"fragShader != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
               ,0x19c);
  }
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

virtual void compileShaders (void)
	{
		const char*		vertSource	= getSimpleShaderSource(glu::SHADERTYPE_VERTEX);
		const char*		fragSource	= getSimpleShaderSource(glu::SHADERTYPE_FRAGMENT);

		const GLuint	vertShader	= glCreateShader(GL_VERTEX_SHADER);
		const GLuint	fragShader	= glCreateShader(GL_FRAGMENT_SHADER);

		TCU_CHECK(vertShader != 0);
		TCU_CHECK(fragShader != 0);

		glShaderSource(vertShader, 1, &vertSource, 0);
		glCompileShader(vertShader);

		glShaderSource(fragShader, 1, &fragSource, 0);
		glCompileShader(fragShader);

		GLU_CHECK();

		m_vertShader = vertShader;
		m_fragShader = fragShader;
	}